

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O2

void read_pub_files<ESF>(ESF *pub,string *filename,bool auto_split)

{
  vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_> *this;
  pointer pPVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  undefined8 extraout_RAX;
  uint uVar7;
  allocator<char> local_1b9;
  uint local_1b8;
  char header_buf [10];
  string filename_template;
  Pub_File local_170;
  char fn_buf [256];
  
  std::vector<Pub_File,_std::allocator<Pub_File>_>::clear(&pub->files);
  this = &pub->data;
  std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::clear(this);
  convert_pub_filename(&filename_template,filename);
  uVar7 = 1;
  snprintf(fn_buf,0x100,filename_template._M_dataplus._M_p,1);
  __stream = fopen(fn_buf,"rb");
  eodata_safe_fail_filename = (filename->_M_dataplus)._M_p;
  if (__stream == (FILE *)0x0) {
    Console::Err("Could not load file: %s");
    exit(1);
  }
  sVar6 = fread(header_buf,1,10,__stream);
  if (sVar6 != 10) {
    fclose(__stream);
    eodata_safe_fail(0x127);
    std::__cxx11::string::~string((string *)&filename_template);
    _Unwind_Resume(extraout_RAX);
  }
  *(undefined4 *)(pub->rid)._M_elems = header_buf._3_4_;
  *(undefined2 *)(pub->len)._M_elems = header_buf._7_2_;
  uVar3 = PacketProcessor::Number((uchar)header_buf._7_2_,SUB21(header_buf._7_2_,1),0xfe,0xfe);
  local_1b8 = PacketProcessor::Number(header_buf[9],0xfe,0xfe,0xfe);
  std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::resize
            (this,(long)(int)(uVar3 + 1));
  iVar5 = 0;
  do {
    if (((int)uVar3 <= iVar5) || (999 < uVar7)) break;
    snprintf(fn_buf,0x100,filename_template._M_dataplus._M_p,(ulong)uVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,fn_buf,&local_1b9);
    local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Pub_File,_std::allocator<Pub_File>_>::emplace_back<Pub_File>(&pub->files,&local_170)
    ;
    Pub_File::~Pub_File(&local_170);
    pPVar1 = (pub->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = read_single_file<ESF>(pub,pPVar1 + -1,auto_split,local_1b8,iVar5 + 1);
    iVar5 = iVar4 + iVar5;
    uVar7 = uVar7 + 1;
  } while ((ulong)((long)pPVar1[-1].splits.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)pPVar1[-1].splits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start) < 0x11);
  if ((int)local_1b8 < 1) {
    bVar2 = std::operator==(&(pub->data).
                             super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].name,"eof");
    if (bVar2) {
      std::vector<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>::pop_back(this);
    }
  }
  std::__cxx11::string::~string((string *)&filename_template);
  return;
}

Assistant:

void read_pub_files(T& pub, const std::string& filename, bool auto_split)
{
	pub.files.clear();
	pub.data.clear();

	std::string filename_template = convert_pub_filename(filename);
	char fn_buf[256];
	int file_number = 1;

	std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number);

	std::FILE *fh = std::fopen(fn_buf, "rb");
	eodata_safe_fail_filename = filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", filename.c_str());
		std::exit(1);
	}

	char header_buf[10];
	SAFE_READ(header_buf, sizeof(char), 10, fh);

	std::memcpy(pub.rid.data(), header_buf + 3, 4);
	std::memcpy(pub.len.data(), header_buf + 7, 2);

	int readobj = 0;
	int numobj = PacketProcessor::Number(pub.len[0], pub.len[1]);
	int version = PacketProcessor::Number(header_buf[9]);

	pub.data.resize(numobj + 1);

	while (readobj < numobj && file_number < 1000)
	{
		std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number++);
		pub.files.push_back(Pub_File{fn_buf, {}});
		Pub_File& pub_file = pub.files.back();
		readobj += read_single_file(pub, pub_file, auto_split, version, readobj + 1);

		// Only a single file is loaded if auto-splitting occurs
		if (pub_file.splits.size() > 2)
			break;
	}

	if (version < 1 && pub.data.back().name == "eof")
		pub.data.pop_back();
}